

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols_core.cpp
# Opt level: O0

vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *
cpptrace::detail::resolve_frames
          (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *frames)

{
  undefined1 local_30 [8];
  vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_> dlframes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *frames_local;
  
  dlframes.super__Vector_base<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)frames;
  get_frames_object_info
            ((vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_> *)local_30,
             frames);
  libdwarf::resolve_frames
            (__return_storage_ptr__,
             (vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_> *)local_30);
  std::vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_>::~vector
            ((vector<cpptrace::object_frame,_std::allocator<cpptrace::object_frame>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<stacktrace_frame> resolve_frames(const std::vector<frame_ptr>& frames) {
        #if defined(CPPTRACE_GET_SYMBOLS_WITH_LIBDWARF) \
            || defined(CPPTRACE_GET_SYMBOLS_WITH_ADDR2LINE)
         auto dlframes = get_frames_object_info(frames);
        #endif
        #if defined(CPPTRACE_GET_SYMBOLS_WITH_LIBDWARF) && defined(CPPTRACE_GET_SYMBOLS_WITH_DBGHELP)
         std::vector<stacktrace_frame> trace = libdwarf::resolve_frames(dlframes);
         fill_blanks(trace, dbghelp::resolve_frames);
         return trace;
        #else
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_LIBDL
          return libdl::resolve_frames(frames);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_LIBDWARF
          return libdwarf::resolve_frames(dlframes);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_DBGHELP
          return dbghelp::resolve_frames(frames);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_ADDR2LINE
          return addr2line::resolve_frames(dlframes);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_LIBBACKTRACE
          return libbacktrace::resolve_frames(frames);
         #endif
         #ifdef CPPTRACE_GET_SYMBOLS_WITH_NOTHING
          return nothing::resolve_frames(frames);
         #endif
        #endif
    }